

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArrayIterator.cpp
# Opt level: O2

void __thiscall
Js::JavascriptArrayIterator::JavascriptArrayIterator
          (JavascriptArrayIterator *this,DynamicType *type,Var iterable,
          JavascriptArrayIteratorKind kind)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  DynamicObject::DynamicObject(&this->super_DynamicObject,type,true);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01389778;
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->m_iterableObject,iterable);
  this->m_nextIndex = 0;
  this->m_kind = kind;
  if ((type->super_Type).typeId != TypeIds_ArrayIterator) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArrayIterator.cpp"
                                ,0xf,"(type->GetTypeId() == TypeIds_ArrayIterator)",
                                "type->GetTypeId() == TypeIds_ArrayIterator");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((RecyclableObject *)(this->m_iterableObject).ptr ==
      (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
      super_JavascriptLibraryBase).undefinedValue.ptr) {
    (this->m_iterableObject).ptr = (void *)0x0;
  }
  return;
}

Assistant:

JavascriptArrayIterator::JavascriptArrayIterator(DynamicType* type, Var iterable, JavascriptArrayIteratorKind kind):
        DynamicObject(type),
        m_iterableObject(iterable),
        m_nextIndex(0),
        m_kind(kind)
    {
        Assert(type->GetTypeId() == TypeIds_ArrayIterator);
        if (m_iterableObject == this->GetLibrary()->GetUndefined())
        {
            m_iterableObject = nullptr;
        }
    }